

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  U32 UVar15;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  U32 UVar23;
  U32 UVar24;
  ulong uVar25;
  U32 UVar26;
  int *piVar27;
  size_t offbaseFound;
  BYTE *litEnd;
  BYTE *litLimit_w;
  size_t local_c0;
  ulong local_b8;
  uint local_ac;
  BYTE *local_a8;
  int *local_a0;
  seqStore_t *local_98;
  uint local_90;
  uint local_8c;
  ulong local_88;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  uint local_5c;
  ulong local_58;
  BYTE *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar2 = (ms->window).base;
  local_5c = (ms->window).dictLimit;
  uVar18 = (ulong)local_5c;
  local_68 = pBVar2 + uVar18;
  local_90 = (ms->cParams).minMatch;
  if (5 < local_90) {
    local_90 = 6;
  }
  if (local_90 < 5) {
    local_90 = 4;
  }
  local_ac = (ms->cParams).searchLog;
  local_8c = 6;
  if (local_ac < 6) {
    local_8c = local_ac;
  }
  if (local_8c < 5) {
    local_8c = 4;
  }
  pZVar3 = ms->dictMatchState;
  local_50 = (pZVar3->window).base;
  local_38 = local_50 + (pZVar3->window).dictLimit;
  local_70 = (pZVar3->window).nextSrc;
  piVar27 = (int *)((ulong)(((int)src - ((int)local_68 + (int)local_38)) + (int)local_70 == 0) +
                   (long)src);
  UVar24 = *rep;
  UVar15 = rep[1];
  ms->lazySkipping = 0;
  piVar22 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar19 = (ulong)uVar8;
  uVar21 = ((int)piVar22 - (int)(pBVar2 + uVar19)) + 1;
  uVar11 = 8;
  if (uVar21 < 8) {
    uVar11 = uVar21;
  }
  if (piVar22 < pBVar2 + uVar19) {
    uVar11 = 0;
  }
  if (uVar8 < uVar11 + uVar8) {
    uVar10 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_90 == 5) {
        uVar25 = *(long *)(pBVar2 + uVar19) * -0x30e4432345000000;
LAB_018e8a1a:
        UVar23 = (U32)((uVar25 ^ uVar10) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_90 == 6) {
          uVar25 = *(long *)(pBVar2 + uVar19) * -0x30e4432340650000;
          goto LAB_018e8a1a;
        }
        UVar23 = (*(int *)(pBVar2 + uVar19) * -0x61c8864f ^ (uint)uVar10) >> (0x18U - cVar5 & 0x1f);
      }
      ms->hashCache[(uint)uVar19 & 7] = UVar23;
      uVar19 = uVar19 + 1;
    } while (uVar11 + uVar8 != uVar19);
  }
  pBVar14 = (BYTE *)(srcSize + (long)src);
  local_40 = rep;
  if (piVar27 < piVar22) {
    local_5c = ((int)local_50 - (int)local_70) + local_5c;
    local_78 = local_50 + -(ulong)local_5c;
    local_48 = (int *)(pBVar14 + -0x20);
    local_a8 = pBVar14;
    local_98 = seqStore;
    local_88 = uVar18;
    local_80 = piVar22;
    do {
      piVar16 = (int *)((long)piVar27 + 1);
      uVar8 = (((int)piVar27 - (int)pBVar2) - UVar24) + 1;
      uVar11 = (uint)uVar18;
      piVar17 = (int *)(pBVar2 + uVar8);
      if (uVar8 < uVar11) {
        piVar17 = (int *)(local_50 + (uVar8 - local_5c));
      }
      bVar7 = true;
      if ((uVar8 - uVar11 < 0xfffffffd) && (*piVar17 == *piVar16)) {
        pBVar13 = pBVar14;
        if (uVar8 < uVar11) {
          pBVar13 = local_70;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar27 + 5),(BYTE *)(piVar17 + 1),pBVar14,pBVar13,
                           local_68);
        local_b8 = sVar9 + 4;
        bVar7 = false;
        pBVar14 = local_a8;
        uVar18 = local_88;
        piVar22 = local_80;
        seqStore = local_98;
      }
      else {
        local_b8 = 0;
      }
      uVar19 = 1;
      if (bVar7) {
        local_c0 = 999999999;
        if (local_90 == 6) {
          if (local_8c == 6) {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_6(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
          else if (local_8c == 5) {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_5(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
          else {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_4(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
        }
        else if (local_90 == 5) {
          if (local_8c == 6) {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_6(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
          else if (local_8c == 5) {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_5(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
          else {
            uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_4(ms,(BYTE *)piVar27,pBVar14,&local_c0);
          }
        }
        else if (local_8c == 6) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_6(ms,(BYTE *)piVar27,pBVar14,&local_c0);
        }
        else if (local_8c == 5) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_5(ms,(BYTE *)piVar27,pBVar14,&local_c0);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_4(ms,(BYTE *)piVar27,pBVar14,&local_c0);
        }
        uVar19 = local_c0;
        piVar22 = piVar27;
        if (uVar10 <= local_b8) {
          uVar10 = local_b8;
          uVar19 = 1;
          piVar22 = piVar16;
        }
        piVar16 = piVar22;
        pBVar14 = local_a8;
        uVar18 = local_88;
        piVar22 = local_80;
        seqStore = local_98;
        local_b8 = uVar10;
        if (3 < uVar10) {
          if (uVar19 < 4) goto LAB_018e8d75;
          uVar25 = (long)piVar16 + (-(long)pBVar2 - uVar19) + -0xfffffffd;
          pBVar12 = pBVar2;
          pBVar13 = local_68;
          if ((uint)uVar25 < (uint)local_88) {
            pBVar12 = local_78;
            pBVar13 = local_38;
          }
          local_a0 = piVar16;
          if ((src < piVar16) && (uVar25 = uVar25 & 0xffffffff, pBVar13 < pBVar12 + uVar25)) {
            pBVar12 = pBVar12 + uVar25;
            do {
              piVar27 = (int *)((long)piVar16 + -1);
              pBVar12 = pBVar12 + -1;
              local_b8 = uVar10;
              local_a0 = piVar16;
              local_58 = uVar19;
              if ((*(BYTE *)piVar27 != *pBVar12) ||
                 (uVar10 = uVar10 + 1, local_b8 = uVar10, local_a0 = piVar27, piVar27 <= src))
              break;
              piVar16 = piVar27;
            } while (pBVar13 < pBVar12);
          }
          UVar23 = (U32)uVar19;
          UVar26 = UVar23 - 3;
          UVar15 = UVar24;
          goto LAB_018e8d80;
        }
        uVar19 = (long)piVar27 - (long)src;
        piVar27 = (int *)((long)piVar27 + (uVar19 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar19);
      }
      else {
LAB_018e8d75:
        UVar23 = (U32)uVar19;
        UVar26 = UVar24;
        local_a0 = piVar16;
LAB_018e8d80:
        uVar19 = (long)local_a0 - (long)src;
        if (local_48 < local_a0) {
          ZSTD_safecopyLiterals(seqStore->lit,(BYTE *)src,(BYTE *)local_a0,(BYTE *)local_48);
          pBVar14 = local_a8;
          uVar18 = local_88;
          piVar22 = local_80;
          seqStore = local_98;
        }
        else {
          pBVar13 = seqStore->lit;
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar13 = *src;
          *(undefined8 *)(pBVar13 + 8) = uVar6;
          if (0x10 < uVar19) {
            pBVar13 = seqStore->lit;
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar13 + 0x18) = uVar6;
            if (0x20 < (long)uVar19) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar20 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar13 + lVar20 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar20 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar20 = lVar20 + 0x20;
              } while (pBVar12 + 0x20 < pBVar13 + uVar19);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar19;
        if (0xffff < uVar19) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4 = seqStore->sequences;
        psVar4->litLength = (U16)uVar19;
        psVar4->offBase = UVar23;
        if (0xffff < local_b8 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_b8 - 3);
        seqStore->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar8 = ms->nextToUpdate;
          uVar18 = (ulong)uVar8;
          uVar11 = ((int)piVar22 - (int)(pBVar2 + uVar18)) + 1;
          if (7 < uVar11) {
            uVar11 = 8;
          }
          if (piVar22 < pBVar2 + uVar18) {
            uVar11 = 0;
          }
          if (uVar8 < uVar11 + uVar8) {
            uVar19 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_90 == 5) {
                uVar10 = *(long *)(pBVar2 + uVar18) * -0x30e4432345000000;
LAB_018e8f1b:
                UVar24 = (U32)((uVar10 ^ uVar19) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_90 == 6) {
                  uVar10 = *(long *)(pBVar2 + uVar18) * -0x30e4432340650000;
                  goto LAB_018e8f1b;
                }
                UVar24 = (*(int *)(pBVar2 + uVar18) * -0x61c8864f ^ (uint)uVar19) >>
                         (0x18U - cVar5 & 0x1f);
              }
              ms->hashCache[(uint)uVar18 & 7] = UVar24;
              uVar18 = uVar18 + 1;
            } while (uVar11 + uVar8 != uVar18);
          }
          ms->lazySkipping = 0;
          pBVar14 = local_a8;
          uVar18 = local_88;
          piVar22 = local_80;
          seqStore = local_98;
        }
        src = (void *)((long)local_a0 + local_b8);
        pBVar13 = local_78;
        piVar27 = (int *)src;
        do {
          UVar24 = UVar26;
          if (piVar22 < piVar27) break;
          uVar8 = ((int)piVar27 - (int)pBVar2) - UVar15;
          uVar11 = (uint)uVar18;
          pBVar12 = pBVar2;
          if (uVar8 < uVar11) {
            pBVar12 = pBVar13;
          }
          if ((uVar8 - uVar11 < 0xfffffffd) && (*(int *)(pBVar12 + uVar8) == *piVar27)) {
            pBVar13 = pBVar14;
            if (uVar8 < uVar11) {
              pBVar13 = local_70;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar27 + 1),(BYTE *)((long)(pBVar12 + uVar8) + 4),pBVar14,
                               pBVar13,local_68);
            pBVar14 = local_98->lit;
            if (local_48 < src) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar14 = *src;
              *(undefined8 *)(pBVar14 + 8) = uVar6;
            }
            psVar4 = local_98->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < sVar9 + 1) {
              local_98->longLengthType = ZSTD_llt_matchLength;
              local_98->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_98->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar9 + 1);
            local_98->sequences = psVar4 + 1;
            src = (void *)((long)piVar27 + sVar9 + 4);
            bVar7 = true;
            pBVar14 = local_a8;
            pBVar13 = local_78;
            uVar18 = local_88;
            piVar22 = local_80;
            seqStore = local_98;
            piVar27 = (int *)src;
            UVar26 = UVar15;
          }
          else {
            bVar7 = false;
            UVar24 = UVar15;
          }
          UVar15 = UVar24;
          UVar24 = UVar26;
        } while (bVar7);
      }
    } while (piVar27 < piVar22);
  }
  *local_40 = UVar24;
  local_40[1] = UVar15;
  return (long)pBVar14 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}